

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *
Catch::sortTests(vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__return_storage_ptr__,
                IConfig *config,
                vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *unsortedTestCases)

{
  pointer pTVar1;
  size_type sVar2;
  pointer ppVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  pair<unsigned_long,_const_Catch::TestCase_*> *hashed;
  long lVar8;
  pointer ppVar9;
  size_type sVar10;
  __normal_iterator<std::pair<unsigned_long,_const_Catch::TestCase_*>_*,_std::vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>_>
  __i;
  pointer ppVar11;
  TestCase *testCase;
  pointer pTVar12;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  indexed_tests;
  uint local_5c;
  vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
  local_58;
  vector<Catch::TestCase,std::allocator<Catch::TestCase>> *local_40;
  pointer local_38;
  
  iVar4 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x10])(config);
  if (iVar4 == 2) {
    local_40 = (vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__;
    seedRng(config);
    uVar5 = (*(config->super_NonCopyable)._vptr_NonCopyable[0x11])(config);
    local_58.
    super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    clara::std::
    vector<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
    ::reserve(&local_58,
              ((long)(unsortedTestCases->
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(unsortedTestCases->
                     super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859);
    pTVar12 = (unsortedTestCases->
              super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pTVar1 = (unsortedTestCases->
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar12 != pTVar1) {
      do {
        sVar2 = (pTVar12->super_TestCaseInfo).name._M_string_length;
        uVar7 = 0xcbf29ce484222325;
        if (sVar2 != 0) {
          sVar10 = 0;
          uVar7 = 0xcbf29ce484222325;
          do {
            uVar7 = ((long)(pTVar12->super_TestCaseInfo).name._M_dataplus._M_p[sVar10] ^ uVar7) *
                    0x100000001b3;
            sVar10 = sVar10 + 1;
          } while (sVar2 != sVar10);
        }
        lVar6 = (uVar7 ^ uVar5) * 0x100000001b3;
        local_5c = (int)((ulong)lVar6 >> 0x20) * (int)lVar6;
        local_38 = pTVar12;
        std::
        vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
        ::emplace_back<unsigned_int,Catch::TestCase_const*>
                  ((vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>
                    *)&local_58,&local_5c,&local_38);
        pTVar12 = pTVar12 + 1;
      } while (pTVar12 != pTVar1);
    }
    ppVar9 = local_58.
             super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar3 = local_58.
             super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_58.
        super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_58.
        super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar8 = (long)local_58.
                    super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = lVar8 >> 4;
      lVar6 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                (local_58.
                 super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_58.
                 super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar8 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                  (ppVar3,ppVar9);
      }
      else {
        ppVar11 = ppVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                  (ppVar3,ppVar11);
        for (; ppVar11 != ppVar9; ppVar11 = ppVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCase_const*>*,std::vector<std::pair<unsigned_long,Catch::TestCase_const*>,std::allocator<std::pair<unsigned_long,Catch::TestCase_const*>>>>,__gnu_cxx::__ops::_Val_comp_iter<Catch::sortTests(Catch::IConfig_const&,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&)::__0>>
                    (ppVar11);
        }
      }
    }
    __return_storage_ptr__ = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_40;
    *(undefined8 *)local_40 = 0;
    *(undefined8 *)(local_40 + 8) = 0;
    *(undefined8 *)(local_40 + 0x10) = 0;
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::reserve
              ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)local_40,
               (long)local_58.
                     super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_58.
                     super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 4);
    ppVar3 = local_58.
             super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar9 = local_58.
                  super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar3; ppVar9 = ppVar9 + 1)
    {
      std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>::
      emplace_back<Catch::TestCase_const&>
                ((vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__,
                 ppVar9->second);
    }
    if (local_58.
        super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<std::pair<unsigned_long,_const_Catch::TestCase_*>,_std::allocator<std::pair<unsigned_long,_const_Catch::TestCase_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else if (iVar4 == 1) {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    pTVar12 = (__return_storage_ptr__->
              super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pTVar1 = (__return_storage_ptr__->
             super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar12 != pTVar1) {
      uVar7 = ((long)pTVar1 - (long)pTVar12 >> 3) * -0x2c8590b21642c859;
      lVar6 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar12,pTVar1,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<Catch::TestCase*,std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pTVar12,pTVar1);
    }
  }
  else {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
         (vector<Catch::TestCase,std::allocator<Catch::TestCase>> *)__return_storage_ptr__;
}

Assistant:

std::vector<TestCase> sortTests( IConfig const& config, std::vector<TestCase> const& unsortedTestCases ) {
        switch( config.runOrder() ) {
            case RunTests::InDeclarationOrder:
                // already in declaration order
                break;

            case RunTests::InLexicographicalOrder: {
                std::vector<TestCase> sorted = unsortedTestCases;
                std::sort( sorted.begin(), sorted.end() );
                return sorted;
            }

            case RunTests::InRandomOrder: {
                seedRng( config );
                TestHasher h{ config.rngSeed() };

                using hashedTest = std::pair<TestHasher::hash_t, TestCase const*>;
                std::vector<hashedTest> indexed_tests;
                indexed_tests.reserve( unsortedTestCases.size() );

                for (auto const& testCase : unsortedTestCases) {
                    indexed_tests.emplace_back(h(testCase), &testCase);
                }

                std::sort(indexed_tests.begin(), indexed_tests.end(),
                          [](hashedTest const& lhs, hashedTest const& rhs) {
                          if (lhs.first == rhs.first) {
                              return lhs.second->name < rhs.second->name;
                          }
                          return lhs.first < rhs.first;
                });

                std::vector<TestCase> sorted;
                sorted.reserve( indexed_tests.size() );

                for (auto const& hashed : indexed_tests) {
                    sorted.emplace_back(*hashed.second);
                }

                return sorted;
            }
        }
        return unsortedTestCases;
    }